

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_time.c
# Opt level: O0

int64_t dos_to_unix(uint32_t dos_time)

{
  time_t tVar1;
  undefined1 local_48 [8];
  tm ts;
  uint16_t msDate;
  uint16_t msTime;
  uint32_t dos_time_local;
  
  ts.tm_zone._2_2_ = (undefined2)dos_time;
  ts.tm_zone._0_2_ = (ushort)(dos_time >> 0x10);
  ts.tm_mday = ((int)(uint)(ushort)ts.tm_zone >> 9) + 0x50;
  ts.tm_hour = ((int)(uint)(ushort)ts.tm_zone >> 5 & 0xfU) - 1;
  ts.tm_min = (ushort)ts.tm_zone & 0x1f;
  ts.tm_sec = (int)(dos_time & 0xffff) >> 0xb;
  local_48._4_4_ = (int)(dos_time & 0xffff) >> 5 & 0x3f;
  local_48._0_4_ = (dos_time & 0x1f) << 1;
  ts.tm_wday = -1;
  ts.tm_zone._4_4_ = dos_time;
  tVar1 = mktime((tm *)local_48);
  return tVar1;
}

Assistant:

int64_t
dos_to_unix(uint32_t dos_time)
{
	uint16_t msTime, msDate;
	struct tm ts;

	msTime = (0xFFFF & dos_time);
	msDate = (dos_time >> 16);
	ts.tm_year = ((msDate >> 9) & 0x7f) + 80; /* Years since 1900. */
	ts.tm_mon = ((msDate >> 5) & 0x0f) - 1; /* Month number. */
	ts.tm_mday = msDate & 0x1f; /* Day of month. */
	ts.tm_hour = (msTime >> 11) & 0x1f;
	ts.tm_min = (msTime >> 5) & 0x3f;
	ts.tm_sec = (msTime << 1) & 0x3e;
	ts.tm_isdst = -1;
	return mktime(&ts);
}